

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar8 = (window->Scroll).x;
  fVar3 = (window->Scroll).y;
  fVar7 = (window->ScrollTarget).x;
  if (fVar7 < 3.4028235e+38) {
    fVar8 = (window->ScrollbarSizes).x;
    fVar9 = (window->ScrollTargetCenterRatio).x;
    fVar4 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar4) {
      if (fVar7 <= fVar4) {
        fVar7 = fVar7 * fVar9 + 0.0;
      }
      else {
        fVar10 = ((window->ScrollMax).x + (window->SizeFull).x) - fVar8;
        if (fVar10 - fVar4 <= fVar7) {
          fVar7 = fVar7 + (fVar10 - fVar7) * fVar9;
        }
      }
    }
    fVar8 = fVar7 - fVar9 * ((window->SizeFull).x - fVar8);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (3.4028235e+38 < *pfVar1 || *pfVar1 == 3.4028235e+38) goto LAB_0011b36a;
  fVar7 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar7 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar7 = fVar7 * window->ParentWindow->FontWindowScale;
    }
    fVar3 = (GImGui->Style).FramePadding.y;
    fVar7 = fVar3 + fVar3 + fVar7;
  }
  fVar3 = ImGuiWindow::MenuBarHeight(window);
  fVar4 = fVar3 + fVar7 + (window->ScrollbarSizes).y;
  fVar3 = (window->ScrollTarget).y;
  fVar7 = (window->ScrollTargetCenterRatio).y;
  fVar9 = (window->ScrollTargetEdgeSnapDist).y;
  if (0.0 < fVar9) {
    if (fVar3 <= fVar9) {
      fVar3 = fVar3 * fVar7;
      fVar9 = 0.0;
    }
    else {
      fVar10 = ((window->ScrollMax).y + (window->SizeFull).y) - fVar4;
      if (fVar3 < fVar10 - fVar9) goto LAB_0011b34f;
      fVar9 = (fVar10 - fVar3) * fVar7;
    }
    fVar3 = fVar3 + fVar9;
  }
LAB_0011b34f:
  fVar3 = fVar3 - fVar7 * ((window->SizeFull).y - fVar4);
LAB_0011b36a:
  IVar5.x = (float)(int)(float)(-(uint)(0.0 <= fVar8) & (uint)fVar8);
  IVar5.y = (float)(int)(float)(-(uint)(0.0 <= fVar3) & (uint)fVar3);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = IVar5.x;
  auVar6._4_4_ = IVar5.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar2._8_8_ = 0;
    auVar2._0_4_ = (window->ScrollMax).x;
    auVar2._4_4_ = (window->ScrollMax).y;
    auVar6 = minps(auVar6,auVar2);
    IVar5 = auVar6._0_8_;
  }
  return IVar5;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float decoration_total_width = window->ScrollbarSizes.x;
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
        {
            float snap_x_min = 0.0f;
            float snap_x_max = window->ScrollMax.x + window->SizeFull.x - decoration_total_width;
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        }
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - decoration_total_width);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_total_height = window->TitleBarHeight() + window->MenuBarHeight() + window->ScrollbarSizes.y;
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
        {
            float snap_y_min = 0.0f;
            float snap_y_max = window->ScrollMax.y + window->SizeFull.y - decoration_total_height;
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        }
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - decoration_total_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}